

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-pprint.cc
# Opt level: O0

ostream * std::operator<<(ostream *os,ushort2 *v)

{
  ostream *poVar1;
  const_reference pvVar2;
  ushort2 *v_local;
  ostream *os_local;
  
  poVar1 = std::operator<<(os,"(");
  pvVar2 = array<unsigned_short,_2UL>::operator[](v,0);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*pvVar2);
  poVar1 = std::operator<<(poVar1,", ");
  pvVar2 = array<unsigned_short,_2UL>::operator[](v,1);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*pvVar2);
  std::operator<<(poVar1,")");
  return os;
}

Assistant:

std::ostream &operator<<(std::ostream &os, const tinyusdz::value::ushort2 &v) {
  os << "(" << v[0] << ", " << v[1] << ")";
  return os;
}